

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

AMPLS_MP_Solver *
AMPLS__internal__Open
          (unique_ptr<mp::BasicBackend,_std::default_delete<mp::BasicBackend>_> p_be,CCallbacks cb)

{
  long *plVar1;
  AMPLS_MP_Solver *pAVar2;
  long *plVar3;
  
  pAVar2 = (AMPLS_MP_Solver *)operator_new(0x18);
  pAVar2->internal_info_ = (void *)0x0;
  pAVar2->solver_info_ = (void *)0x0;
  pAVar2->user_info_ = (void *)0x0;
  plVar3 = (long *)operator_new(0xb8);
  memset(plVar3 + 2,0,0xa8);
  plVar3[1] = (long)&PTR__OutputHandler_005d48c8;
  plVar3[3] = 0;
  plVar3[4] = 0;
  plVar3[5] = 0;
  plVar3[6] = 0;
  plVar3[7] = 0;
  plVar3[8] = 0;
  plVar3[9] = 0;
  plVar3[10] = 0;
  plVar3[0xb] = 0;
  plVar3[0xc] = 0;
  plVar3[0xd] = 0;
  plVar3[0xe] = 0;
  plVar3[0xf] = 0;
  plVar3[0x10] = 0;
  plVar3[0x11] = 0;
  plVar3[0x12] = 0;
  plVar3[0x13] = (long)(plVar3 + 0x15);
  pAVar2->internal_info_ = plVar3;
  plVar1 = *(long **)p_be._M_t.
                     super___uniq_ptr_impl<mp::BasicBackend,_std::default_delete<mp::BasicBackend>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>
                     .super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl;
  *(undefined8 *)
   p_be._M_t.super___uniq_ptr_impl<mp::BasicBackend,_std::default_delete<mp::BasicBackend>_>._M_t.
   super__Tuple_impl<0UL,_mp::BasicBackend_*,_std::default_delete<mp::BasicBackend>_>.
   super__Head_base<0UL,_mp::BasicBackend_*,_false>._M_head_impl = 0;
  *plVar3 = (long)plVar1;
  plVar1[0x5d] = (long)cb.init;
  plVar1[0x5e] = (long)cb.check;
  *(undefined4 *)(plVar1 + 0x5f) = cb.additionalText._0_4_;
  *(undefined4 *)((long)plVar1 + 0x2fc) = cb.additionalText._4_4_;
  *(undefined4 *)(plVar1 + 0x60) = cb.diagnostics._0_4_;
  *(undefined4 *)((long)plVar1 + 0x304) = cb.diagnostics._4_4_;
  plVar1[0x4a] = (long)(plVar3 + 1);
  (**(code **)(*plVar1 + 0x60))(plVar1);
  *(undefined4 *)(plVar1 + 0x30) = 1;
  return pAVar2;
}

Assistant:

AMPLS_MP_Solver* AMPLS__internal__Open(std::unique_ptr<mp::BasicBackend> p_be,
  CCallbacks cb = {}) {
  AMPLS_MP_Solver* slv = new AMPLS_MP_Solver();
  AMPLS__internal__TryCatchWrapper( slv, [&]() {
    auto ii = new AMPLS_MP__internal();
    slv->internal_info_ = ii;
    ii->p_be_ = std::move(p_be);
    auto be = ii->p_be_.get();
    be->GetCallbacks() = cb;
    be->set_output_handler(&ii->output_h_);
    char* argv[] = {(char*)"ampls-driver", nullptr};
    be->Init(argv);
    be->set_wantsol(1);       // user can still modify by 'wantsol=...'
    return 0;
  } );
  return slv;
}